

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

void __thiscall Engine::solve(Engine *this,Problem *p,string *problemLabel)

{
  Clause *pCVar1;
  RESULT RVar2;
  unsigned_long __res;
  long lVar3;
  Connector *pCVar4;
  mapped_type *pmVar5;
  socklen_t __len;
  sockaddr *__addr;
  uint i;
  ulong uVar6;
  int __fd;
  char *pcVar7;
  random_device r;
  
  this->problem = p;
  if (so.rnd_seed == 0) {
    std::random_device::random_device(&r);
    so.rnd_seed = std::random_device::_M_getval();
    std::random_device::~random_device(&r);
  }
  (this->rnd)._M_x =
       (ulong)(long)so.rnd_seed % 0x7fffffff + (ulong)((ulong)(long)so.rnd_seed % 0x7fffffff == 0);
  init(this,(EVP_PKEY_CTX *)p);
  lVar3 = std::chrono::_V2::steady_clock::now();
  (this->time_out).__d.__r = so.time_out.__r * 1000000 + lVar3;
  lVar3 = std::chrono::_V2::steady_clock::now();
  __len = 1000000;
  (this->init_time).__r = (lVar3 - (this->start_time).__d.__r) / 1000000;
  this->base_memory = 0.0;
  pCVar4 = (Connector *)operator_new(0xb8);
  __fd = so.cpprofiler_port;
  cpprofiler::Connector::Connector(pCVar4,so.cpprofiler_port);
  profilerConnector = pCVar4;
  if (so.cpprofiler_enabled == true) {
    cpprofiler::Connector::connect(pCVar4,__fd,__addr,__len);
  }
  if (so.learnt_stats == true) {
    std::ofstream::open(learntStatsStream,0x1b15b9);
    std::operator<<((ostream *)learntStatsStream,"id,length,block");
    if (so.learnt_stats_nogood == true) {
      std::operator<<((ostream *)learntStatsStream,",nogood");
    }
    std::operator<<((ostream *)learntStatsStream,",rawActivity\n");
  }
  RVar2 = search(this,problemLabel);
  this->status = RVar2;
  if (RVar2 - RES_LUN < 2) {
    pcVar7 = "=====UNSATISFIABLE=====\n";
    if (0 < this->solutions) {
      pcVar7 = "==========\n";
    }
    std::operator<<(this->output_stream,pcVar7);
  }
  if (so.learnt_stats == true) {
    for (uVar6 = 0; uVar6 < sat.learnts.sz; uVar6 = uVar6 + 1) {
      pCVar1 = sat.learnts.data[uVar6];
      r.field_0._0_4_ = pCVar1[1].data[*(uint *)pCVar1 >> 8].x;
      pmVar5 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&learntClauseString_abi_cxx11_,(key_type *)&r);
      std::operator<<((ostream *)learntStatsStream,(string *)pmVar5);
      std::operator<<((ostream *)learntStatsStream,",");
      std::ostream::operator<<
                ((ostream *)learntStatsStream,pCVar1[1].data[(ulong)(*(uint *)pCVar1 >> 8) - 1].x);
      std::operator<<((ostream *)learntStatsStream,"\n");
    }
  }
  if ((((so.print_nodes == false) && (profilerConnector->_connected != true)) ||
      (cpprofiler::Connector::done(profilerConnector), profilerConnector->_connected != true)) ||
     (cpprofiler::Connector::disconnect(profilerConnector), profilerConnector != (Connector *)0x0))
  {
    pCVar4 = profilerConnector;
    cpprofiler::Message::~Message((Message *)profilerConnector);
  }
  else {
    pCVar4 = (Connector *)0x0;
  }
  operator_delete(pCVar4);
  if (0 < so.verbosity) {
    printStats(this);
  }
  return;
}

Assistant:

void Engine::solve(Problem* p, const std::string& problemLabel) {
	problem = p;

	// Setting the random seed
	if (so.rnd_seed == 0) {
		std::random_device r;
		so.rnd_seed = r();
	}
	rnd = std::default_random_engine(so.rnd_seed);

	init();

	time_out = chuffed_clock::now() + so.time_out;

	init_time = std::chrono::duration_cast<duration>(chuffed_clock::now() - start_time);
	base_memory = memUsed();

#ifdef HAS_PROFILER
	profilerConnector = new cpprofiler::Connector(so.cpprofiler_port);
	if (so.cpprofiler_enabled) {
		profilerConnector->connect();
	}
#endif

	/* if (so.debug) { */
	/*   for (int i = 0 ; i < 2*sat.nVars() ; i++) { */
	/*     std::cerr << "literal " << i << " is " << litString[i] << "\n"; */
	/*   } */
	/* } */

	if (so.learnt_stats) {
		learntStatsStream.open("learnt-stats.csv");
		learntStatsStream << "id,length,block";
		if (so.learnt_stats_nogood) {
			learntStatsStream << ",nogood";
		}
		learntStatsStream << ",rawActivity\n";
	}

	// sequential
	status = search(problemLabel);
	if (status == RES_GUN || status == RES_LUN) {
		if (solutions > 0) {
			(*output_stream) << "==========\n";
		} else {
			(*output_stream) << "=====UNSATISFIABLE=====\n";
		}
	}

	if (so.learnt_stats) {
		for (unsigned int i = 0; i < sat.learnts.size(); i++) {
			Clause& c = *(sat.learnts[i]);
			//        std::cerr << "clausescore," << c.clauseID() << ","
			//        << c.rawActivity() << "\n";
			const int id = c.clauseID();
			learntStatsStream << learntClauseString[id];
			learntStatsStream << ",";
			learntStatsStream << c.rawActivity();
			learntStatsStream << "\n";
		}
	}

#ifdef HAS_PROFILER
	if (doProfiling()) {
		profilerConnector->done();
		if (profilerConnector->connected()) {
			profilerConnector->disconnect();
		}
	}
	delete profilerConnector;
#endif

	if (so.verbosity >= 1) {
		printStats();
	}
}